

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

RunStats __thiscall soul::ResolutionPass::run(ResolutionPass *this,bool ignoreTypeAndConstantErrors)

{
  Allocator *a;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  pool_ref *this_00;
  ModuleBase *m;
  RunStats RVar5;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> local_c8;
  ResolutionPass local_b8;
  RunStats local_50;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> local_40;
  ulong local_30;
  size_t i;
  ResolutionPass *pRStack_20;
  bool ignoreTypeAndConstantErrors_local;
  ResolutionPass *this_local;
  RunStats runStats;
  
  i._7_1_ = ignoreTypeAndConstantErrors;
  pRStack_20 = this;
  RunStats::RunStats((RunStats *)&this_local);
  if ((this->module->isFullyResolved & 1U) == 0) {
    bVar2 = AST::ModuleBase::isTemplateModule(this->module);
    if (bVar2) {
      this->module->isFullyResolved = true;
    }
    else {
      do {
        RunStats::clear((RunStats *)&this_local);
        tryPass<soul::ResolutionPass::QualifiedIdentifierResolver>
                  (this,(RunStats *)&this_local,true);
        tryPass<soul::ResolutionPass::TypeResolver>(this,(RunStats *)&this_local,true);
        tryPass<soul::ResolutionPass::ProcessorInstanceResolver>(this,(RunStats *)&this_local,true);
        tryPass<soul::ResolutionPass::NamespaceAliasResolver>(this,(RunStats *)&this_local,true);
        tryPass<soul::ResolutionPass::OperatorResolver>(this,(RunStats *)&this_local,true);
        rebuildVariableUseCounts(this->module);
        tryPass<soul::ResolutionPass::FunctionResolver>(this,(RunStats *)&this_local,true);
        tryPass<soul::ResolutionPass::ConstantFolder>(this,(RunStats *)&this_local,true);
        rebuildVariableUseCounts(this->module);
        if (runStats.numFailures == 0) {
          tryPass<soul::ResolutionPass::GenericFunctionResolver>(this,(RunStats *)&this_local,true);
        }
        local_30 = 0;
        while( true ) {
          uVar1 = local_30;
          iVar3 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
          local_40.s = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar3);
          sVar4 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::size(&local_40);
          if (sVar4 <= uVar1) break;
          a = this->allocator;
          iVar3 = (*(this->module->super_Scope)._vptr_Scope[0x11])(&this->module->super_Scope);
          local_c8.s = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var_00,iVar3);
          this_00 = (pool_ref *)
                    ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::operator[]
                              (&local_c8,local_30);
          m = pool_ref::operator_cast_to_ModuleBase_(this_00);
          ResolutionPass(&local_b8,a,m);
          RVar5 = run(&local_b8,(bool)(i._7_1_ & 1));
          local_50 = RVar5;
          RunStats::add((RunStats *)&this_local,&local_50);
          ~ResolutionPass(&local_b8);
          local_30 = local_30 + 1;
        }
        if (this_local == (ResolutionPass *)0x0) goto LAB_003a0043;
      } while (runStats.numFailures != 0);
      if ((i._7_1_ & 1) == 0) {
        tryPass<soul::ResolutionPass::FunctionResolver>(this,(RunStats *)&this_local,false);
        tryPass<soul::ResolutionPass::QualifiedIdentifierResolver>
                  (this,(RunStats *)&this_local,false);
        tryPass<soul::ResolutionPass::TypeResolver>(this,(RunStats *)&this_local,false);
        tryPass<soul::ResolutionPass::ProcessorInstanceResolver>(this,(RunStats *)&this_local,false)
        ;
        tryPass<soul::ResolutionPass::NamespaceAliasResolver>(this,(RunStats *)&this_local,false);
        tryPass<soul::ResolutionPass::OperatorResolver>(this,(RunStats *)&this_local,false);
        tryPass<soul::ResolutionPass::GenericFunctionResolver>(this,(RunStats *)&this_local,false);
LAB_003a0043:
        SanityCheckPass::runPostResolutionChecks(this->module);
        this->module->isFullyResolved = true;
      }
    }
  }
  RVar5.numReplaced = runStats.numFailures;
  RVar5.numFailures = (size_t)this_local;
  return RVar5;
}

Assistant:

RunStats run (bool ignoreTypeAndConstantErrors)
    {
        RunStats runStats;

        if (module.isFullyResolved)
            return runStats;

        if (module.isTemplateModule())
        {
            module.isFullyResolved = true;
            return runStats;
        }

        for (;;)
        {
            runStats.clear();

            tryPass<QualifiedIdentifierResolver> (runStats, true);
            tryPass<TypeResolver> (runStats, true);
            tryPass<ProcessorInstanceResolver> (runStats, true);
            tryPass<NamespaceAliasResolver> (runStats, true);
            tryPass<OperatorResolver> (runStats, true);
            rebuildVariableUseCounts (module);
            tryPass<FunctionResolver> (runStats, true);
            tryPass<ConstantFolder> (runStats, true);

            rebuildVariableUseCounts (module);

            if (runStats.numReplaced == 0)
                tryPass<GenericFunctionResolver> (runStats, true);

            // Can't use a range-based-for here because the array will change during the loop
            for (size_t i = 0; i < module.getSubModules().size(); ++i)
                runStats.add (ResolutionPass (allocator, module.getSubModules()[i])
                                .run (ignoreTypeAndConstantErrors));

            if (runStats.numFailures == 0)
                break;

            if (runStats.numReplaced == 0)
            {
                // failed to resolve anything new, so can't get any further..
                if (ignoreTypeAndConstantErrors)
                    return runStats;

                tryPass<FunctionResolver> (runStats, false);
                tryPass<QualifiedIdentifierResolver> (runStats, false);
                tryPass<TypeResolver> (runStats, false);
                tryPass<ProcessorInstanceResolver> (runStats, false);
                tryPass<NamespaceAliasResolver> (runStats, false);
                tryPass<OperatorResolver> (runStats, false);
                tryPass<GenericFunctionResolver> (runStats, false);
                break;
            }
        }

        SanityCheckPass::runPostResolutionChecks (module);

        module.isFullyResolved = true;
        return runStats;
    }